

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::AddSource(cmGeneratorTarget *this,string *src)

{
  pointer *pppTVar1;
  iterator __position;
  undefined8 uVar2;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  cmGeneratorExpression local_98;
  cmListFileBacktrace local_58;
  
  cmTarget::AddSource(this->Target,src);
  cmMakefile::GetBacktrace(&local_58,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression(&local_98,&local_58);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_b0,(string *)&local_98);
  uVar2 = local_b0._0_8_;
  local_b0._0_8_ = (pointer)0x0;
  local_b0._8_8_ = uVar2;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_b0);
  *(bool *)(uVar2 + 0x198) = true;
  local_b0._0_8_ = operator_new(0x10);
  local_b0._8_8_ = 0;
  local_a0 = (undefined1  [8])0x0;
  (((TargetPropertyEntry *)local_b0._0_8_)->ge).x_ = (cmCompiledGeneratorExpression *)uVar2;
  ((TargetPropertyEntry *)local_b0._0_8_)->LinkImplItem = &TargetPropertyEntry::NoLinkImplItem;
  __position._M_current =
       (this->SourceEntries).
       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->SourceEntries).
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&this->SourceEntries,__position,(TargetPropertyEntry **)local_b0);
  }
  else {
    *__position._M_current = (TargetPropertyEntry *)local_b0._0_8_;
    pppTVar1 = &(this->SourceEntries).
                super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::clear(&(this->SourceFilesMap)._M_t);
  this->LinkImplementationLanguageIsContextDependent = true;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_b0 + 8));
  cmGeneratorExpression::~cmGeneratorExpression(&local_98);
  cmListFileBacktrace::~cmListFileBacktrace(&local_58);
  return;
}

Assistant:

void cmGeneratorTarget::AddSource(const std::string& src)
{
  this->Target->AddSource(src);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(
                        new TargetPropertyEntry(cge));
  this->SourceFilesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}